

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O2

Point * MeshLib::Trait::getConformal(Point *__return_storage_ptr__,string *s)

{
  double pz;
  double py;
  string subs;
  char line [1024];
  
  std::__cxx11::string::find((char *)s,0x1158c2);
  std::__cxx11::string::substr((ulong)&subs,(ulong)s);
  __isoc99_sscanf(subs._M_dataplus._M_p,"conformal=(%lf %lf %lf)%s",__return_storage_ptr__,&py,&pz,
                  line);
  __return_storage_ptr__->v[1] = py;
  __return_storage_ptr__->v[2] = pz;
  std::__cxx11::string::~string((string *)&subs);
  return __return_storage_ptr__;
}

Assistant:

Point Trait::getConformal(std::string s)
{
	std::string::size_type pos = s.find ("conformal");
	std::string subs = s.substr (pos);
	double px, py, pz;
	char line[1024];
	sscanf(subs.c_str (),"conformal=(%lf %lf %lf)%s",&px,&py,&pz,line);
	return Point(px,py,pz);
}